

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::parse(Datetime *this,string *input,size_type *start,string *format)

{
  bool bVar1;
  size_type sVar2;
  Pig pig;
  
  sVar2 = *start;
  Pig::Pig(&pig,input);
  if (sVar2 != 0) {
    Pig::skipN(&pig,(int)sVar2);
  }
  sVar2 = Pig::cursor(&pig);
  bVar1 = parse_epoch(this,&pig);
  if (bVar1) {
    sVar2 = Pig::cursor(&pig);
LAB_00147f87:
    *start = sVar2;
  }
  else {
    bVar1 = parse_formatted(this,&pig,format);
    if ((bVar1) && (bVar1 = validate(this), bVar1)) {
      sVar2 = Pig::cursor(&pig);
    }
    else {
      bVar1 = parse_date_time_ext(this,&pig);
      if ((((!bVar1) && (bVar1 = parse_date_time(this,&pig), !bVar1)) &&
          ((isoEnabled != true ||
           ((((bVar1 = parse_date_ext(this,&pig), !bVar1 &&
              ((((standaloneDateEnabled != true || (bVar1 = parse_date(this,&pig), !bVar1)) &&
                (bVar1 = parse_time_utc_ext(this,&pig), !bVar1)) &&
               ((bVar1 = parse_time_utc(this,&pig), !bVar1 &&
                (bVar1 = parse_time_off_ext(this,&pig), !bVar1)))))) &&
             (bVar1 = parse_time_ext(this,&pig,true), !bVar1)) &&
            (((standaloneTimeEnabled != true || (bVar1 = parse_time(this,&pig,true), !bVar1)) &&
             (((standaloneTimeEnabled & 1U) == 0 || (bVar1 = parse_time_off(this,&pig), !bVar1))))))
           )))) || (bVar1 = validate(this), !bVar1)) {
        Pig::restoreTo(&pig,sVar2);
        bVar1 = parse_named(this,&pig);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_00148001;
        }
        sVar2 = Pig::cursor(&pig);
        goto LAB_00147f87;
      }
      sVar2 = Pig::cursor(&pig);
    }
    *start = sVar2;
    resolve(this);
  }
  bVar1 = true;
LAB_00148001:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pig._text.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return bVar1;
}

Assistant:

bool Datetime::parse (
  const std::string& input,
  std::string::size_type& start,
  const std::string& format)
{
  auto i = start;
  Pig pig (input);
  if (i)
    pig.skipN (static_cast <int> (i));

  auto checkpoint = pig.cursor ();

  // Parse epoch first, as it's the most common scenario.
  if (parse_epoch (pig))
  {
    // ::validate and ::resolve are not needed in this case.
    start = pig.cursor ();
    return true;
  }

  if (parse_formatted (pig, format))
  {
    // Check the values and determine time_t.
    if (validate ())
    {
      start = pig.cursor ();
      resolve ();
      return true;
    }
  }

  // Allow parse_date_time and parse_date_time_ext regardless of
  // Datetime::isoEnabled setting, because these formats are relied upon by
  // the 'import' command, JSON parser and hook system.
  if (parse_date_time_ext   (pig) || // Strictest first.
      parse_date_time       (pig) ||
      (Datetime::isoEnabled &&
       (                                    parse_date_ext      (pig)  ||
        (Datetime::standaloneDateEnabled && parse_date          (pig)) ||
                                            parse_time_utc_ext  (pig)  ||
                                            parse_time_utc      (pig)  ||
                                            parse_time_off_ext  (pig)  ||
                                            parse_time_ext      (pig)  ||
        (Datetime::standaloneTimeEnabled && parse_time          (pig)) || // Time last, as it is the most permissive.
        (Datetime::standaloneTimeEnabled && parse_time_off      (pig))
       )
      )
     )
  {
    // Check the values and determine time_t.
    if (validate ())
    {
      start = pig.cursor ();
      resolve ();
      return true;
    }
  }

  pig.restoreTo (checkpoint);

  if (parse_named (pig))
  {
    // ::validate and ::resolve are not needed in this case.
    start = pig.cursor ();
    return true;
  }

  return false;
}